

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

bool QCoreApplication::notifyInternal2(QObject *receiver,QEvent *event)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Type threadData_00;
  Type pQVar4;
  undefined8 in_RSI;
  void **in_RDI;
  long in_FS_OFFSET;
  bool selfRequired;
  QThreadData *threadData;
  QObjectPrivate *d;
  QScopedScopeLevelCounter scopeLevelCounter;
  bool result;
  void *cbdata [3];
  QEvent *in_stack_ffffffffffffff78;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  Callback in_stack_ffffffffffffffc0;
  bool local_39;
  QScopedScopeLevelCounter local_38;
  byte local_29 [17];
  byte *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::d_func((QObject *)0x33eae0);
  threadData_00 =
       QBasicAtomicPointer<QThreadData>::loadAcquire((QBasicAtomicPointer<QThreadData> *)0x33eaf3);
  bVar1 = threadData_00->requiresCoreApplication & 1;
  if (bVar1 != 0) {
    pQVar4 = QBasicAtomicPointer<QCoreApplication>::loadRelaxed
                       ((QBasicAtomicPointer<QCoreApplication> *)0x33eb1c);
    if (pQVar4 == (Type)0x0) {
      local_39 = false;
      goto LAB_0033ec41;
    }
  }
  local_29[0] = 0;
  local_18 = local_29;
  bVar2 = QInternal::activateCallbacks(in_stack_ffffffffffffffc0,in_RDI);
  if (bVar2) {
    local_39 = (bool)(local_29[0] & 1);
  }
  else {
    local_38.threadData = (QThreadData *)&DAT_aaaaaaaaaaaaaaaa;
    QScopedScopeLevelCounter::QScopedScopeLevelCounter(&local_38,threadData_00);
    if (bVar1 == 0) {
      local_39 = doNotify((QObject *)
                          CONCAT17(in_stack_ffffffffffffff87,
                                   CONCAT16(in_stack_ffffffffffffff86,
                                            CONCAT15(in_stack_ffffffffffffff85,
                                                     in_stack_ffffffffffffff80))),
                          in_stack_ffffffffffffff78);
    }
    else {
      pQVar4 = QBasicAtomicPointer<QCoreApplication>::loadRelaxed
                         ((QBasicAtomicPointer<QCoreApplication> *)0x33ec09);
      iVar3 = (*(pQVar4->super_QObject)._vptr_QObject[0xc])(pQVar4,in_RDI,in_RSI);
      local_39 = (bool)((byte)iVar3 & 1);
    }
    QScopedScopeLevelCounter::~QScopedScopeLevelCounter(&local_38);
  }
LAB_0033ec41:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QCoreApplication::notifyInternal2(QObject *receiver, QEvent *event)
{
    // Qt enforces the rule that events can only be sent to objects in
    // the current thread, so receiver->d_func()->threadData is
    // equivalent to QThreadData::current(), just without the function
    // call overhead.
    QObjectPrivate *d = receiver->d_func();
    QThreadData *threadData = d->threadData.loadAcquire();
    bool selfRequired = threadData->requiresCoreApplication;
    if (selfRequired && !qApp)
        return false;

    // Make it possible for Qt Script to hook into events even
    // though QApplication is subclassed...
    bool result = false;
    void *cbdata[] = { receiver, event, &result };
    if (QInternal::activateCallbacks(QInternal::EventNotifyCallback, cbdata)) {
        return result;
    }

    QScopedScopeLevelCounter scopeLevelCounter(threadData);
    if (!selfRequired)
        return doNotify(receiver, event);

#if QT_VERSION >= QT_VERSION_CHECK(7, 0, 0)
    if (!QThread::isMainThread())
        return false;
#endif
    return qApp->notify(receiver, event);
}